

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

size_t get_ngram_size_for(IndexType type)

{
  runtime_error *this;
  
  if (type - GRAM3 < 4) {
    return *(size_t *)(&DAT_001afa30 + (ulong)(type - GRAM3) * 8);
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"unhandled index type (ngram)");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

size_t get_ngram_size_for(IndexType type) {
    switch (type) {
        case IndexType::GRAM3:
            return 3;
        case IndexType::HASH4:
            return 4;
        case IndexType::TEXT4:
            return 4;
        case IndexType::WIDE8:
            return 8;
    }
    throw std::runtime_error("unhandled index type (ngram)");
}